

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::find_position<int>
          (dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
           *this,int *key)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  
  uVar3 = this->num_buckets - 1;
  uVar2 = uVar3 & (long)*key;
  iVar1 = (this->key_info).empty_key;
  iVar5 = this->table[uVar2];
  uVar4 = uVar2;
  if (iVar1 != iVar5) {
    uVar6 = 0xffffffffffffffff;
    lVar7 = 1;
    do {
      if ((this->num_deleted == 0) || ((this->key_info).delkey != iVar5)) {
        if (*key == iVar5) {
          uVar4 = 0xffffffffffffffff;
          goto LAB_005fee7d;
        }
      }
      else if (uVar6 == 0xffffffffffffffff) {
        uVar6 = uVar2;
      }
      uVar2 = uVar2 + lVar7 & uVar3;
      iVar5 = this->table[uVar2];
      lVar7 = lVar7 + 1;
    } while (iVar1 != iVar5);
    uVar4 = uVar2;
    if (uVar6 != 0xffffffffffffffff) {
      uVar4 = uVar6;
    }
  }
  uVar2 = 0xffffffffffffffff;
LAB_005fee7d:
  pVar8.second = uVar4;
  pVar8.first = uVar2;
  return pVar8;
}

Assistant:

size_type bucket_count() const { return num_buckets; }